

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uct_node.cpp
# Opt level: O0

int __thiscall megumax::UCTNode::depth(UCTNode *this)

{
  UCTNode *in_RDI;
  int ply;
  UCTNode *iter;
  int local_14;
  UCTNode *local_10;
  
  local_14 = 0;
  local_10 = in_RDI;
  while (local_10->parent_ != (UCTNode *)0x0) {
    local_10 = parent(local_10);
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int UCTNode::depth() const {
    const UCTNode* iter = this;
    int ply = 0;
    while (iter->parent_ != nullptr) {
        iter = iter->parent();
        ++ply;
    }
    return ply;
}